

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bech32.c
# Opt level: O1

int main(void)

{
  byte bVar1;
  byte bVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  uchar *puVar6;
  uchar *bytes_out;
  byte bVar7;
  bool bVar8;
  size_t written;
  long *local_40;
  long *local_38;
  
  puVar6 = (uchar *)calloc(0x5a,1);
  if (puVar6 == (uchar *)0x0) {
    bVar7 = 0;
  }
  else {
    bVar7 = 0;
    iVar4 = wally_addr_segwit_to_bytes
                      ("abcdefghijklmnopqrstuvwxyzabcdefghijklmnopqrstuvwxyzabcdefghijklmnopqrstuvwxyzabcdefg"
                       ,"tb",0,puVar6,0x5a,(size_t *)&local_38);
    if (iVar4 == -2) {
      free(puVar6);
      bVar7 = 1;
    }
  }
  if (bVar7 == 0) {
    puts("check_segwit_to_bytes test failed!");
  }
  puVar6 = (uchar *)calloc(0x5a,1);
  local_40 = (long *)0x0;
  if (puVar6 == (uchar *)0x0) {
LAB_00102cf9:
    puts("check_segwit_addr test failed!");
    bVar7 = 0;
  }
  else {
    iVar4 = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6",puVar6,0x5a,
                               (size_t *)&local_38);
    if (iVar4 == 0) {
      bVar8 = false;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"bc",0,(char **)&local_40);
      plVar3 = local_40;
      if (iVar4 == 0) {
        iVar4 = bcmp(local_40,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",0x2b);
        bVar8 = iVar4 == 0;
        wally_free_string((char *)plVar3);
      }
    }
    else {
      bVar8 = false;
    }
    iVar4 = wally_hex_to_bytes("00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262"
                               ,puVar6,0x5a,(size_t *)&local_38);
    if (iVar4 == 0) {
      bVar1 = 0;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"tb",0,(char **)&local_40);
      plVar3 = local_40;
      if (iVar4 == 0) {
        iVar4 = bcmp(local_40,"tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7",0x3f)
        ;
        bVar1 = iVar4 == 0 & bVar8;
        wally_free_string((char *)plVar3);
      }
    }
    else {
      bVar1 = 0;
    }
    iVar4 = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6",puVar6,0x5a,
                               (size_t *)&local_38);
    if (iVar4 == 0) {
      bVar2 = 0;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"bc",0,(char **)&local_40);
      plVar3 = local_40;
      if (iVar4 == 0) {
        iVar4 = bcmp(local_40,"bc1qw508d6qejxtdg4y5r3zarvary0c5xw7kv8f3t4",0x2b);
        bVar2 = iVar4 == 0 & bVar1;
        wally_free_string((char *)plVar3);
      }
    }
    else {
      bVar2 = 0;
    }
    iVar4 = wally_hex_to_bytes("5128751e76e8199196d454941c45d1b3a323f1433bd6751e76e8199196d454941c45d1b3a323f1433bd6"
                               ,puVar6,0x5a,(size_t *)&local_38);
    if (iVar4 == 0) {
      bVar1 = 0;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"bc",0,(char **)&local_40);
      plVar3 = local_40;
      if (iVar4 == 0) {
        iVar4 = bcmp(local_40,
                     "bc1pw508d6qejxtdg4y5r3zarvary0c5xw7kw508d6qejxtdg4y5r3zarvary0c5xw7kt5nd6y",
                     0x4b);
        bVar1 = iVar4 == 0 & bVar2;
        wally_free_string((char *)plVar3);
      }
    }
    else {
      bVar1 = 0;
    }
    iVar4 = wally_hex_to_bytes("6002751e",puVar6,0x5a,(size_t *)&local_38);
    if (iVar4 == 0) {
      bVar2 = 0;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"bc",0,(char **)&local_40);
      if (iVar4 == 0) {
        bVar2 = (*(long *)((long)local_40 + 7) == 0x6a35327a646771 &&
                *local_40 == 0x7130357773316362) & bVar1;
        wally_free_string((char *)local_40);
      }
    }
    else {
      bVar2 = 0;
    }
    iVar4 = wally_hex_to_bytes("5210751e76e8199196d454941c45d1b3a323",puVar6,0x5a,
                               (size_t *)&local_38);
    if (iVar4 == 0) {
      bVar1 = 0;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"bc",0,(char **)&local_40);
      plVar3 = local_40;
      if (iVar4 == 0) {
        iVar4 = bcmp(local_40,"bc1zw508d6qejxtdg4y5r3zarvaryvaxxpcs",0x25);
        bVar1 = iVar4 == 0 & bVar2;
        wally_free_string((char *)plVar3);
      }
    }
    else {
      bVar1 = 0;
    }
    iVar4 = wally_hex_to_bytes("0020000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                               ,puVar6,0x5a,(size_t *)&local_38);
    if (iVar4 == 0) {
      bVar2 = 0;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"tb",0,(char **)&local_40);
      plVar3 = local_40;
      if (iVar4 == 0) {
        iVar4 = bcmp(local_40,"tb1qqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesrxh6hy",0x3f)
        ;
        bVar2 = iVar4 == 0 & bVar1;
        wally_free_string((char *)plVar3);
      }
    }
    else {
      bVar2 = 0;
    }
    iVar4 = wally_hex_to_bytes("5120000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                               ,puVar6,0x5a,(size_t *)&local_38);
    if (iVar4 == 0) {
      bVar1 = 0;
      iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"tb",0,(char **)&local_40);
      plVar3 = local_40;
      if (iVar4 == 0) {
        iVar4 = bcmp(local_40,"tb1pqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesf3hn0c",0x3f)
        ;
        bVar1 = iVar4 == 0 & bVar2;
        wally_free_string((char *)plVar3);
      }
    }
    else {
      bVar1 = 0;
    }
    iVar4 = wally_hex_to_bytes("512079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798"
                               ,puVar6,0x5a,(size_t *)&local_38);
    if ((iVar4 != 0) ||
       (iVar4 = wally_addr_segwit_from_bytes(puVar6,(size_t)local_38,"bc",0,(char **)&local_40),
       plVar3 = local_40, iVar4 != 0)) {
      free(puVar6);
      goto LAB_00102cf9;
    }
    iVar4 = bcmp(local_40,"bc1p0xlxvlhemja6c4dqv22uapctqupfhlxm9h8z3k2e72q4k9hcz7vqzk5jj0",0x3f);
    wally_free_string((char *)plVar3);
    free(puVar6);
    if (!(bool)(iVar4 == 0 & bVar1)) goto LAB_00102cf9;
  }
  puVar6 = (uchar *)calloc(0x5a,1);
  if (puVar6 != (uchar *)0x0) {
    bytes_out = (uchar *)calloc(0x5a,1);
    if (bytes_out != (uchar *)0x0) {
      iVar4 = wally_addr_segwit_to_bytes
                        ("BC1QW508D6QEJXTDG4Y5R3ZARVARY0C5XW7KV8F3T4","bc",0,puVar6,0x5a,
                         (size_t *)&local_38);
      bVar8 = iVar4 == 0;
      iVar4 = wally_hex_to_bytes("0014751e76e8199196d454941c45d1b3a323f1433bd6",bytes_out,0x5a,
                                 (size_t *)&local_40);
      if (((iVar4 != 0) || (local_38 != local_40)) ||
         (iVar4 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar4 != 0)) {
        bVar8 = false;
      }
      iVar4 = wally_addr_segwit_to_bytes
                        ("tb1qrp33g0q5c5txsp9arysrx4k6zdkfs4nce4xj0gdcccefvpysxf3q0sl5k7","tb",0,
                         puVar6,0x5a,(size_t *)&local_38);
      iVar5 = wally_hex_to_bytes("00201863143c14c5166804bd19203356da136c985678cd4d27a1b8c6329604903262"
                                 ,bytes_out,0x5a,(size_t *)&local_40);
      if (((iVar5 == 0) && (local_38 == local_40)) &&
         (iVar5 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar5 == 0)) {
        bVar1 = iVar4 == 0 & bVar8;
      }
      else {
        bVar1 = 0;
      }
      iVar4 = wally_addr_segwit_to_bytes
                        ("bc1pw508d6qejxtdg4y5r3zarvary0c5xw7kw508d6qejxtdg4y5r3zarvary0c5xw7kt5nd6y"
                         ,"bc",0,puVar6,0x5a,(size_t *)&local_38);
      iVar5 = wally_hex_to_bytes("5128751e76e8199196d454941c45d1b3a323f1433bd6751e76e8199196d454941c45d1b3a323f1433bd6"
                                 ,bytes_out,0x5a,(size_t *)&local_40);
      if (((iVar5 == 0) && (local_38 == local_40)) &&
         (iVar5 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar5 == 0)) {
        bVar1 = iVar4 == 0 & bVar1;
      }
      else {
        bVar1 = 0;
      }
      iVar4 = wally_addr_segwit_to_bytes("BC1SW50QGDZ25J","bc",0,puVar6,0x5a,(size_t *)&local_38);
      iVar5 = wally_hex_to_bytes("6002751e",bytes_out,0x5a,(size_t *)&local_40);
      if (((iVar5 == 0) && (local_38 == local_40)) &&
         (iVar5 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar5 == 0)) {
        bVar1 = iVar4 == 0 & bVar1;
      }
      else {
        bVar1 = 0;
      }
      iVar4 = wally_addr_segwit_to_bytes
                        ("bc1zw508d6qejxtdg4y5r3zarvaryvaxxpcs","bc",0,puVar6,0x5a,
                         (size_t *)&local_38);
      iVar5 = wally_hex_to_bytes("5210751e76e8199196d454941c45d1b3a323",bytes_out,0x5a,
                                 (size_t *)&local_40);
      if (((iVar5 == 0) && (local_38 == local_40)) &&
         (iVar5 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar5 == 0)) {
        bVar1 = iVar4 == 0 & bVar1;
      }
      else {
        bVar1 = 0;
      }
      iVar4 = wally_addr_segwit_to_bytes
                        ("tb1qqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesrxh6hy","tb",0,
                         puVar6,0x5a,(size_t *)&local_38);
      iVar5 = wally_hex_to_bytes("0020000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                                 ,bytes_out,0x5a,(size_t *)&local_40);
      if (((iVar5 == 0) && (local_38 == local_40)) &&
         (iVar5 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar5 == 0)) {
        bVar1 = iVar4 == 0 & bVar1;
      }
      else {
        bVar1 = 0;
      }
      iVar4 = wally_addr_segwit_to_bytes
                        ("tb1pqqqqp399et2xygdj5xreqhjjvcmzhxw4aywxecjdzew6hylgvsesf3hn0c","tb",0,
                         puVar6,0x5a,(size_t *)&local_38);
      iVar5 = wally_hex_to_bytes("5120000000c4a5cad46221b2a187905e5266362b99d5e91c6ce24d165dab93e86433"
                                 ,bytes_out,0x5a,(size_t *)&local_40);
      if (((iVar5 == 0) && (local_38 == local_40)) &&
         (iVar5 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar5 == 0)) {
        bVar1 = iVar4 == 0 & bVar1;
      }
      else {
        bVar1 = 0;
      }
      iVar4 = wally_addr_segwit_to_bytes
                        ("bc1p0xlxvlhemja6c4dqv22uapctqupfhlxm9h8z3k2e72q4k9hcz7vqzk5jj0","bc",0,
                         puVar6,0x5a,(size_t *)&local_38);
      iVar5 = wally_hex_to_bytes("512079be667ef9dcbbac55a06295ce870b07029bfcdb2dce28d959f2815b16f81798"
                                 ,bytes_out,0x5a,(size_t *)&local_40);
      if (((iVar5 == 0) && (local_38 == local_40)) &&
         (iVar5 = bcmp(puVar6,bytes_out,(size_t)local_38), iVar5 == 0)) {
        free(puVar6);
        free(bytes_out);
        if ((bool)(iVar4 == 0 & bVar1)) goto LAB_00103099;
        goto LAB_0010308b;
      }
      free(puVar6);
      puVar6 = bytes_out;
    }
    free(puVar6);
  }
LAB_0010308b:
  puts("check_addr_segwit test failed!");
  bVar7 = 0;
LAB_00103099:
  return (int)(bVar7 ^ 1);
}

Assistant:

static bool check_segwit_to_bytes(void)
{
    unsigned char *mem = calloc(90, sizeof(unsigned char));
    size_t written;
    int ret;

    if (!mem)
        return false;

    ret = wally_addr_segwit_to_bytes(invalid, "tb", 0, mem, 90, &written);

    if (ret != WALLY_EINVAL)
        return false;

    free(mem);

    return true;
}